

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O2

Matrix33 * AML::diag(Matrix33 *__return_storage_ptr__,Vector3 *rhs)

{
  double local_58;
  double local_50;
  double dStack_48;
  undefined8 local_40;
  double local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  double local_18;
  
  local_58 = (rhs->field_0).data[0];
  local_50 = 0.0;
  dStack_48 = 0.0;
  local_40 = 0;
  local_38 = (rhs->field_0).data[1];
  local_20 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_18 = (rhs->field_0).data[2];
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 diag(const Vector3& rhs)
    {
        double data[3][3];
        data[0][0] = rhs.x;
        data[0][1] = 0.0;
        data[0][2] = 0.0;
        data[1][0] = 0.0;
        data[1][1] = rhs.y;
        data[1][2] = 0.0;
        data[2][0] = 0.0;
        data[2][1] = 0.0;
        data[2][2] = rhs.z;
        return Matrix33(data);
    }